

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnterLibrary.cpp
# Opt level: O3

void __thiscall EnterLibrary::operator()(EnterLibrary *this)

{
  HttpRequest *this_00;
  Session *this_01;
  bool bVar1;
  unsigned_short uVar2;
  string *psVar3;
  reference this_02;
  ostream *poVar4;
  Session *session;
  json Json;
  string reply;
  undefined1 local_68 [8];
  json_value local_60;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = Session::IsConnected((this->super_Event).m_Owner);
  if (bVar1) {
    this_00 = &(this->super_Event).m_Request;
    HttpRequest::SetRequest(this_00,"GET","/api/v1/tema/library/access","HTTP/1.1","");
    HttpRequest::SetHost(this_00,"ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    HttpRequest::ClearHeaders(this_00);
    HttpRequest::AddHeader(this_00,"Connection","keep-alive");
    HttpRequest::ClearCookies(this_00);
    psVar3 = Session::GetConnectSid_abi_cxx11_((this->super_Event).m_Owner);
    HttpRequest::AddCookie(this_00,"connect.sid",(psVar3->_M_dataplus)._M_p);
    HttpRequest::SetData(this_00,"");
    Session::OpenConnection((this->super_Event).m_Owner);
    HttpRequest::Send(this_00,(this->super_Event).m_Owner);
    Connection::ReceiveHttps_abi_cxx11_(&local_58,(Connection *)(this->super_Event).m_Owner,session)
    ;
    Session::CloseConnection((this->super_Event).m_Owner);
    uVar2 = HttpReply::ExtractSign(&local_58);
    if (uVar2 == 200) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Enter library successfully",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      local_68[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     )0x0;
      local_60.object = (object_t *)0x0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_68);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_68);
      HttpReply::ExtractData(&local_58,(json *)local_68);
      this_01 = (this->super_Event).m_Owner;
      this_02 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_68,"token");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_38,this_02);
      Session::SetToken(this_01,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_68);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::json_value::destroy((json_value *)(local_68 + 8),(value_t)local_68[0]);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Enter library failed ",0x15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error ",6);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"You are not connected",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please login to proceed this command",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void EnterLibrary::operator()() {
    using namespace std;
    if (!m_Owner->IsConnected()) {
        cout << "You are not connected" << endl;
        cout << "Please login to proceed this command" << endl;
        return;
    }
    m_Request.SetRequest("GET", "/api/v1/tema/library/access", "HTTP/1.1");
    m_Request.SetHost("ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    m_Request.ClearHeaders();
    m_Request.AddHeader("Connection", "keep-alive");
    m_Request.ClearCookies();
    m_Request.AddCookie("connect.sid", m_Owner->GetConnectSid().c_str());
    m_Request.SetData("");
    m_Owner->OpenConnection();
    m_Request.Send(*m_Owner);
    std::string reply = Connection::ReceiveHttps(*m_Owner);
    m_Owner->CloseConnection();
    unsigned short sign = HttpReply::ExtractSign(reply);
    if (sign == 200) {
        cout << "Enter library successfully" << std::endl;
        json Json;
        HttpReply::ExtractData(reply, Json);
        m_Owner->SetToken(Json["token"]);
    }
    else {
        cout << "Enter library failed " << "error " << sign << std::endl;
    }
}